

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Runner::~Runner(Runner *this)

{
  IReporter *pIVar1;
  Runner *this_local;
  
  (this->super_IResultCapture)._vptr_IResultCapture = (_func_int **)&PTR__Runner_0029e948;
  (this->super_IRunner)._vptr_IRunner = (_func_int **)&PTR__Runner_0029e9b0;
  pIVar1 = Ptr<Catch::IReporter>::operator->(&this->m_reporter);
  (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[6])(pIVar1,&this->m_totals);
  (*(this->m_context->super_IContext)._vptr_IContext[8])(this->m_context,this->m_prevRunner);
  (*(this->m_context->super_IContext)._vptr_IContext[9])(this->m_context,0);
  (*(this->m_context->super_IContext)._vptr_IContext[7])(this->m_context,this->m_prevResultCapture);
  (*(this->m_context->super_IContext)._vptr_IContext[9])(this->m_context,this->m_prevConfig);
  AssertionInfo::~AssertionInfo(&this->m_lastAssertionInfo);
  std::vector<Catch::AssertionResult,_std::allocator<Catch::AssertionResult>_>::~vector
            (&this->m_assertionResults);
  std::vector<Catch::ScopedInfo_*,_std::allocator<Catch::ScopedInfo_*>_>::~vector
            (&this->m_scopedInfos);
  Ptr<Catch::IReporter>::~Ptr(&this->m_reporter);
  AssertionResult::~AssertionResult(&this->m_lastResult);
  IRunner::~IRunner(&this->super_IRunner);
  IResultCapture::~IResultCapture(&this->super_IResultCapture);
  return;
}

Assistant:

virtual ~Runner() {
            m_reporter->EndTesting( m_totals );
            m_context.setRunner( m_prevRunner );
            m_context.setConfig( NULL );
            m_context.setResultCapture( m_prevResultCapture );
            m_context.setConfig( m_prevConfig );
        }